

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_77::AsyncTee::ReadSink::fill
          (ReadSink *this,Buffer *inBuffer,
          Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *stoppage)

{
  long *plVar1;
  uint64_t uVar2;
  char *in_RCX;
  _Elt_pointer pAVar3;
  int *piVar4;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar5;
  Promise<void> PVar6;
  Exception local_178;
  
  uVar2 = Buffer::consume((Buffer *)stoppage,
                          (ArrayPtr<unsigned_char> *)
                          &(inBuffer->bufferList).
                           super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_first,
                          (size_t *)
                          &(inBuffer->bufferList).
                           super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node);
  pAVar3 = (_Elt_pointer)
           ((long)&((inBuffer->bufferList).
                    super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur)->ptr + uVar2);
  (inBuffer->bufferList).
  super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = pAVar3;
  if ((inBuffer->bufferList).
      super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
      _M_impl.super__Deque_impl_data._M_start._M_node != (_Map_pointer)0x0) {
    if ((uVar2 != 0) ||
       (*(long *)((long)&(stoppage->ptr).field_1 + 0x28) !=
        *(long *)((long)&(stoppage->ptr).field_1 + 8))) goto LAB_0047e153;
    piVar4 = (int *)0x0;
    if (*in_RCX != '\0') {
      piVar4 = (int *)(in_RCX + 8);
    }
    if (*in_RCX != '\x01') goto LAB_0047e153;
    if (*piVar4 != 1 && pAVar3 == (_Elt_pointer)0x0) {
      Exception::Exception(&local_178,(Exception *)(piVar4 + 2));
      plVar1 = (long *)(inBuffer->bufferList).
                       super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                       ._M_impl.super__Deque_impl_data._M_map_size;
      (**(code **)(*plVar1 + 8))(plVar1,&local_178);
      pAVar3 = (inBuffer->bufferList).
               super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((Buffer *)pAVar3->ptr == inBuffer) {
        pAVar3->ptr = (uchar *)0x0;
      }
      Exception::~Exception(&local_178);
      goto LAB_0047e153;
    }
  }
  local_178.ownFile.content.ptr = (char *)pAVar3;
  (*(code *)**(undefined8 **)
              (inBuffer->bufferList).
              super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size)();
  pAVar3 = (inBuffer->bufferList).
           super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((Buffer *)pAVar3->ptr == inBuffer) {
    pAVar3->ptr = (uchar *)0x0;
  }
LAB_0047e153:
  OVar5 = heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_178);
  PVar6.super_PromiseBase.node.ptr = OVar5.ptr;
  (this->super_SinkBase<unsigned_long>).super_Sink._vptr_Sink =
       (_func_int **)local_178.ownFile.content.ptr;
  (this->super_SinkBase<unsigned_long>).fulfiller =
       (PromiseFulfiller<unsigned_long> *)local_178.ownFile.content.size_;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar6.super_PromiseBase.node;
}

Assistant:

Promise<void> fill(Buffer& inBuffer, const Maybe<Stoppage>& stoppage) override {
      auto amount = inBuffer.consume(buffer, minBytes);
      readSoFar += amount;

      if (minBytes == 0) {
        // We satisfied the read request.
        fulfill(readSoFar);
        return READY_NOW;
      }

      if (amount == 0 && inBuffer.empty()) {
        // We made no progress on the read request and the buffer is tapped out.
        KJ_IF_MAYBE(reason, stoppage) {
          if (reason->is<Eof>() || readSoFar > 0) {
            // Prefer short read to exception.
            fulfill(readSoFar);
          } else {
            reject(cp(reason->get<Exception>()));
          }
          return READY_NOW;
        }
      }

      return READY_NOW;
    }